

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::ChannelsInLayer
               (EXRHeader *exr_header,string *layer_name,
               vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *channels)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar1;
  LayerChannel *pLVar2;
  LayerChannel *pLVar3;
  string *n;
  long in_RDI;
  LayerChannel ch;
  size_t pos_1;
  size_t pos;
  string ch_name;
  int c;
  value_type *in_stack_fffffffffffffec8;
  LayerChannel *in_stack_fffffffffffffed0;
  string local_118 [72];
  string local_d0 [36];
  undefined4 local_ac;
  string local_a8 [32];
  value_type *local_88;
  string local_80 [32];
  LayerChannel *local_60;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  long local_8;
  
  local_8 = in_RDI;
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::clear
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)0x445a1c);
  local_1c = 0;
  do {
    if (*(int *)(local_8 + 0x78) <= local_1c) {
      return;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (*(long *)(local_8 + 0x68) + (long)local_1c * 0x110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)__lhs,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+(__lhs,(char)((ulong)in_stack_fffffffffffffed0 >> 0x38));
      in_stack_fffffffffffffec8 = (value_type *)std::__cxx11::string::find(local_40,(ulong)local_a8)
      ;
      std::__cxx11::string::~string(local_a8);
      local_88 = in_stack_fffffffffffffec8;
      if (in_stack_fffffffffffffec8 != (value_type *)0xffffffffffffffff) {
        if (in_stack_fffffffffffffec8 == (value_type *)0x0) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_d0,(ulong)local_40);
          std::__cxx11::string::operator=(local_40,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
        goto LAB_00445c62;
      }
      local_ac = 4;
    }
    else {
      pLVar2 = (LayerChannel *)std::__cxx11::string::find_last_of((char)local_40,0x2e);
      local_60 = pLVar2;
      if ((pLVar2 != (LayerChannel *)0xffffffffffffffff) &&
         (pLVar3 = (LayerChannel *)std::__cxx11::string::size(), in_stack_fffffffffffffed0 = pLVar2,
         pLVar2 < pLVar3)) {
        std::__cxx11::string::substr((ulong)local_80,(ulong)local_40);
        std::__cxx11::string::operator=(local_40,local_80);
        std::__cxx11::string::~string(local_80);
        in_stack_fffffffffffffed0 = pLVar2;
      }
LAB_00445c62:
      n = (string *)(long)local_1c;
      std::__cxx11::string::string(local_118,local_40);
      LayerChannel::LayerChannel(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,n);
      std::__cxx11::string::~string(local_118);
      std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      LayerChannel::~LayerChannel((LayerChannel *)0x445cc1);
      local_ac = 0;
    }
    std::__cxx11::string::~string(local_40);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static void ChannelsInLayer(const EXRHeader &exr_header,
                            const std::string &layer_name,
                            std::vector<LayerChannel> &channels) {
  channels.clear();
  for (int c = 0; c < exr_header.num_channels; c++) {
    std::string ch_name(exr_header.channels[c].name);
    if (layer_name.empty()) {
      const size_t pos = ch_name.find_last_of('.');
      if (pos != std::string::npos && pos < ch_name.size()) {
        ch_name = ch_name.substr(pos + 1);
      }
    } else {
      const size_t pos = ch_name.find(layer_name + '.');
      if (pos == std::string::npos) continue;
      if (pos == 0) {
        ch_name = ch_name.substr(layer_name.size() + 1);
      }
    }
    LayerChannel ch(size_t(c), ch_name);
    channels.push_back(ch);
  }
}